

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O0

mbedtls_asn1_named_data *
mbedtls_asn1_store_named_data
          (mbedtls_asn1_named_data **head,char *oid,size_t oid_len,uchar *val,size_t val_len)

{
  uchar *puVar1;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t in_R8;
  void *p;
  mbedtls_asn1_named_data *cur;
  char *in_stack_ffffffffffffffb8;
  mbedtls_asn1_named_data *in_stack_ffffffffffffffc0;
  mbedtls_asn1_named_data *local_38;
  
  local_38 = mbedtls_asn1_find_named_data
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x872c84);
  if (local_38 == (mbedtls_asn1_named_data *)0x0) {
    local_38 = (mbedtls_asn1_named_data *)calloc(1,0x40);
    if (local_38 == (mbedtls_asn1_named_data *)0x0) {
      return (mbedtls_asn1_named_data *)0x0;
    }
    (local_38->oid).len = in_RDX;
    puVar1 = (uchar *)calloc(1,in_RDX);
    (local_38->oid).p = puVar1;
    if ((local_38->oid).p == (uchar *)0x0) {
      free(local_38);
      return (mbedtls_asn1_named_data *)0x0;
    }
    memcpy((local_38->oid).p,in_RSI,in_RDX);
    (local_38->val).len = in_R8;
    if (in_R8 != 0) {
      puVar1 = (uchar *)calloc(1,in_R8);
      (local_38->val).p = puVar1;
      if ((local_38->val).p == (uchar *)0x0) {
        free((local_38->oid).p);
        free(local_38);
        return (mbedtls_asn1_named_data *)0x0;
      }
    }
    local_38->next = (mbedtls_asn1_named_data *)*in_RDI;
    *in_RDI = local_38;
  }
  else if (in_R8 == 0) {
    free((local_38->val).p);
    (local_38->val).p = (uchar *)0x0;
  }
  else if ((local_38->val).len != in_R8) {
    puVar1 = (uchar *)calloc(1,in_R8);
    if (puVar1 == (uchar *)0x0) {
      return (mbedtls_asn1_named_data *)0x0;
    }
    free((local_38->val).p);
    (local_38->val).p = puVar1;
    (local_38->val).len = in_R8;
  }
  if ((in_RCX != (void *)0x0) && (in_R8 != 0)) {
    memcpy((local_38->val).p,in_RCX,in_R8);
  }
  return local_38;
}

Assistant:

mbedtls_asn1_named_data *mbedtls_asn1_store_named_data(
    mbedtls_asn1_named_data **head,
    const char *oid, size_t oid_len,
    const unsigned char *val,
    size_t val_len)
{
    mbedtls_asn1_named_data *cur;

    if ((cur = asn1_find_named_data(*head, oid, oid_len)) == NULL) {
        // Add new entry if not present yet based on OID
        //
        cur = (mbedtls_asn1_named_data *) mbedtls_calloc(1,
                                                         sizeof(mbedtls_asn1_named_data));
        if (cur == NULL) {
            return NULL;
        }

        cur->oid.len = oid_len;
        cur->oid.p = (unsigned char *) mbedtls_calloc(1, oid_len);
        if (cur->oid.p == NULL) {
            mbedtls_free(cur);
            return NULL;
        }

        memcpy(cur->oid.p, oid, oid_len);

        cur->val.len = val_len;
        if (val_len != 0) {
            cur->val.p = (unsigned char *) mbedtls_calloc(1, val_len);
            if (cur->val.p == NULL) {
                mbedtls_free(cur->oid.p);
                mbedtls_free(cur);
                return NULL;
            }
        }

        cur->next = *head;
        *head = cur;
    } else if (val_len == 0) {
        mbedtls_free(cur->val.p);
        cur->val.p = NULL;
    } else if (cur->val.len != val_len) {
        /*
         * Enlarge existing value buffer if needed
         * Preserve old data until the allocation succeeded, to leave list in
         * a consistent state in case allocation fails.
         */
        void *p = mbedtls_calloc(1, val_len);
        if (p == NULL) {
            return NULL;
        }

        mbedtls_free(cur->val.p);
        cur->val.p = (unsigned char *)p;
        cur->val.len = val_len;
    }

    if (val != NULL && val_len != 0) {
        memcpy(cur->val.p, val, val_len);
    }

    return cur;
}